

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O2

stumpless_entry * stumpless_set_entry_msgid(stumpless_entry *entry,char *msgid)

{
  _Bool _Var1;
  size_t new_msgid_length;
  size_t local_20;
  
  if (entry == (stumpless_entry *)0x0) {
    raise_argument_empty("entry was NULL");
LAB_0010c47e:
    entry = (stumpless_entry *)0x0;
  }
  else {
    if (msgid == (char *)0x0) {
      lock_entry(entry);
      entry->msgid[0] = '-';
      entry->msgid[1] = '\0';
      entry->msgid_length = 1;
    }
    else {
      _Var1 = validate_msgid(msgid,&local_20);
      if (!_Var1) goto LAB_0010c47e;
      lock_entry(entry);
      entry->msgid_length = local_20;
      memcpy(entry->msgid,msgid,local_20);
      entry->msgid[local_20] = '\0';
    }
    unlock_entry(entry);
    clear_error();
  }
  return entry;
}

Assistant:

struct stumpless_entry *
stumpless_set_entry_msgid( struct stumpless_entry *entry,
                           const char *msgid ) {
  size_t new_msgid_length;

  VALIDATE_ARG_NOT_NULL( entry );

  if( unlikely( msgid && !validate_msgid( msgid, &new_msgid_length ) ) ) {
    return NULL;
  }

  lock_entry( entry );
  if( msgid ) {
    entry->msgid_length = new_msgid_length;
    memcpy( entry->msgid, msgid, new_msgid_length );
    entry->msgid[new_msgid_length] = '\0';
  } else {
    entry->msgid[0] = '-';
    entry->msgid[1] = '\0';
    entry->msgid_length = 1;
  }
  unlock_entry( entry );

  clear_error(  );
  return entry;
}